

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_horiz_rs_sse4.c
# Opt level: O1

void av1_convolve_horiz_rs_sse4_1
               (uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  uint8_t *puVar14;
  uint uVar15;
  uint8_t *puVar16;
  int iVar17;
  ulong uVar18;
  undefined1 in_XMM0 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar21 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar22 [16];
  
  if (0 < w) {
    uVar18 = 0;
    auVar19 = pmovsxbd(in_XMM0,0x40404040);
    do {
      if (0 < h) {
        uVar13 = x_step_qn * 2 + x0_qn;
        uVar15 = x_step_qn * 3 + x0_qn;
        auVar1 = *(undefined1 (*) [16])((long)x_filters + (ulong)((uint)x0_qn >> 4 & 0x3f0));
        auVar2 = *(undefined1 (*) [16])
                  ((long)x_filters + (ulong)((uint)(x_step_qn + x0_qn) >> 4 & 0x3f0));
        auVar3 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar13 >> 4 & 0x3f0));
        auVar4 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar15 >> 4 & 0x3f0));
        puVar14 = dst;
        puVar16 = src + -3;
        iVar17 = h;
        do {
          auVar20 = pmovzxbw(in_XMM5,*(undefined8 *)(puVar16 + (x0_qn >> 0xe)));
          auVar20 = pmaddwd(auVar20,auVar1);
          auVar21 = pmovzxbw(in_XMM6,*(undefined8 *)(puVar16 + (x_step_qn + x0_qn >> 0xe)));
          auVar21 = pmaddwd(auVar21,auVar2);
          auVar20 = phaddd(auVar20,auVar21);
          auVar21 = pmovzxbw(auVar21,*(undefined8 *)(puVar16 + ((int)uVar13 >> 0xe)));
          auVar21 = pmaddwd(auVar21,auVar3);
          auVar22 = pmovzxbw(in_XMM7,*(undefined8 *)(puVar16 + ((int)uVar15 >> 0xe)));
          in_XMM7 = pmaddwd(auVar22,auVar4);
          in_XMM6 = phaddd(auVar21,in_XMM7);
          auVar20 = phaddd(auVar20,in_XMM6);
          auVar21._0_4_ = auVar20._0_4_ + auVar19._0_4_ >> 7;
          auVar21._4_4_ = auVar20._4_4_ + auVar19._4_4_ >> 7;
          auVar21._8_4_ = auVar20._8_4_ + auVar19._8_4_ >> 7;
          auVar21._12_4_ = auVar20._12_4_ + auVar19._12_4_ >> 7;
          auVar20 = packusdw(auVar21,auVar21);
          sVar5 = auVar20._0_2_;
          sVar6 = auVar20._2_2_;
          sVar7 = auVar20._4_2_;
          sVar8 = auVar20._6_2_;
          in_XMM5._0_4_ =
               CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar20[6] - (0xff < sVar8),
                        CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar20[4] - (0xff < sVar7),
                                 CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar20[2] -
                                          (0xff < sVar6),
                                          (0 < sVar5) * (sVar5 < 0x100) * auVar20[0] -
                                          (0xff < sVar5))));
          sVar9 = auVar20._8_2_;
          in_XMM5[4] = (0 < sVar9) * (sVar9 < 0x100) * auVar20[8] - (0xff < sVar9);
          sVar10 = auVar20._10_2_;
          in_XMM5[5] = (0 < sVar10) * (sVar10 < 0x100) * auVar20[10] - (0xff < sVar10);
          sVar11 = auVar20._12_2_;
          in_XMM5[6] = (0 < sVar11) * (sVar11 < 0x100) * auVar20[0xc] - (0xff < sVar11);
          sVar12 = auVar20._14_2_;
          in_XMM5[7] = (0 < sVar12) * (sVar12 < 0x100) * auVar20[0xe] - (0xff < sVar12);
          in_XMM5[8] = (0 < sVar5) * (sVar5 < 0x100) * auVar20[0] - (0xff < sVar5);
          in_XMM5[9] = (0 < sVar6) * (sVar6 < 0x100) * auVar20[2] - (0xff < sVar6);
          in_XMM5[10] = (0 < sVar7) * (sVar7 < 0x100) * auVar20[4] - (0xff < sVar7);
          in_XMM5[0xb] = (0 < sVar8) * (sVar8 < 0x100) * auVar20[6] - (0xff < sVar8);
          in_XMM5[0xc] = (0 < sVar9) * (sVar9 < 0x100) * auVar20[8] - (0xff < sVar9);
          in_XMM5[0xd] = (0 < sVar10) * (sVar10 < 0x100) * auVar20[10] - (0xff < sVar10);
          in_XMM5[0xe] = (0 < sVar11) * (sVar11 < 0x100) * auVar20[0xc] - (0xff < sVar11);
          in_XMM5[0xf] = (0 < sVar12) * (sVar12 < 0x100) * auVar20[0xe] - (0xff < sVar12);
          *(undefined4 *)puVar14 = in_XMM5._0_4_;
          puVar16 = puVar16 + src_stride;
          puVar14 = puVar14 + dst_stride;
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
      uVar18 = uVar18 + 4;
      x0_qn = x0_qn + x_step_qn * 4;
      dst = dst + 4;
    } while (uVar18 < (uint)w);
  }
  return;
}

Assistant:

void av1_convolve_horiz_rs_sse4_1(const uint8_t *src, int src_stride,
                                  uint8_t *dst, int dst_stride, int w, int h,
                                  const int16_t *x_filters, int x0_qn,
                                  int x_step_qn) {
  assert(UPSCALE_NORMATIVE_TAPS == 8);

  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;

  const __m128i round_add = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();

  const uint8_t *src_y;
  uint8_t *dst_y;
  int x_qn = x0_qn;
  for (int x = 0; x < w; x += 4, x_qn += 4 * x_step_qn) {
    const int x_filter_idx0 =
        ((x_qn + 0 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx1 =
        ((x_qn + 1 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx2 =
        ((x_qn + 2 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx3 =
        ((x_qn + 3 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;

    assert(x_filter_idx0 <= RS_SUBPEL_MASK);
    assert(x_filter_idx1 <= RS_SUBPEL_MASK);
    assert(x_filter_idx2 <= RS_SUBPEL_MASK);
    assert(x_filter_idx3 <= RS_SUBPEL_MASK);

    const int16_t *const x_filter0 =
        &x_filters[x_filter_idx0 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter1 =
        &x_filters[x_filter_idx1 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter2 =
        &x_filters[x_filter_idx2 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter3 =
        &x_filters[x_filter_idx3 * UPSCALE_NORMATIVE_TAPS];

    const __m128i fil0_16 = xx_loadu_128(x_filter0);
    const __m128i fil1_16 = xx_loadu_128(x_filter1);
    const __m128i fil2_16 = xx_loadu_128(x_filter2);
    const __m128i fil3_16 = xx_loadu_128(x_filter3);

    src_y = src;
    dst_y = dst;
    for (int y = 0; y < h; y++, src_y += src_stride, dst_y += dst_stride) {
      const uint8_t *const src_x0 =
          &src_y[(x_qn + 0 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x1 =
          &src_y[(x_qn + 1 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x2 =
          &src_y[(x_qn + 2 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint8_t *const src_x3 =
          &src_y[(x_qn + 3 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];

      // Load up the source data. This is 8-bit input data, so each load
      // gets 8 pixels.
      const __m128i src0_8 = xx_loadl_64(src_x0);
      const __m128i src1_8 = xx_loadl_64(src_x1);
      const __m128i src2_8 = xx_loadl_64(src_x2);
      const __m128i src3_8 = xx_loadl_64(src_x3);

      // Now zero-extend up to 16-bit precision, i.e.
      // [ 00 00 00 00 hg fe dc ba ] -> [ 0h 0g 0f 0e 0d 0c 0b 0a ]
      const __m128i src0_16 = _mm_cvtepu8_epi16(src0_8);
      const __m128i src1_16 = _mm_cvtepu8_epi16(src1_8);
      const __m128i src2_16 = _mm_cvtepu8_epi16(src2_8);
      const __m128i src3_16 = _mm_cvtepu8_epi16(src3_8);

      // Multiply by filter coefficients (results in a 32-bit value),
      // and add adjacent pairs, i.e.
      // ([ s7 s6 s5 s4 s3 s2 s1 s0], [ f7 f6 f5 f4 f3 f2 f1 f0 ])
      // -> [ {s7*f7+s6*f6} {s5*f5+s4*f4} {s3*f3+s2*f2} {s1*f1+s0*f0} ]
      const __m128i conv0_32 = _mm_madd_epi16(src0_16, fil0_16);
      const __m128i conv1_32 = _mm_madd_epi16(src1_16, fil1_16);
      const __m128i conv2_32 = _mm_madd_epi16(src2_16, fil2_16);
      const __m128i conv3_32 = _mm_madd_epi16(src3_16, fil3_16);

      // Reduce horizontally and add, i.e.
      // ([ D C B A ], [ S R Q P ]) -> [ S+R Q+P D+C B+A ]
      const __m128i conv01_32 = _mm_hadd_epi32(conv0_32, conv1_32);
      const __m128i conv23_32 = _mm_hadd_epi32(conv2_32, conv3_32);

      const __m128i conv0123_32 = _mm_hadd_epi32(conv01_32, conv23_32);

      // Divide down by (1 << FILTER_BITS), rounding to nearest.
      const __m128i shifted_32 =
          _mm_srai_epi32(_mm_add_epi32(conv0123_32, round_add), FILTER_BITS);

      // Pack 32-bit values into 16-bit values, i.e.
      // ([ D C B A ], [ 0 0 0 0 ]) -> [ 0 0 0 0 D C B A ]
      const __m128i shifted_16 = _mm_packus_epi32(shifted_32, zero);

      // Pack 16-bit values into 8-bit values, i.e.
      // ([ 0 0 0 0 D C B A ], [ 0 0 0 0 0 0 0 0 ])
      // -> [ 0 0 0 0 0 0 DC BA ]
      const __m128i shifted_8 = _mm_packus_epi16(shifted_16, zero);

      // Write to the output
      xx_storel_32(&dst_y[x], shifted_8);
    }
  }
}